

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

void __thiscall
VGMPlayer::ParseXHdr_Data16
          (VGMPlayer *this,UINT32 fileOfs,
          vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_> *xData)

{
  pointer pXVar1;
  UINT8 *pUVar2;
  UINT32 UVar3;
  size_type __new_size;
  uint uVar4;
  
  pXVar1 = (xData->
           super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((xData->super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>).
      _M_impl.super__Vector_impl_data._M_finish != pXVar1) {
    (xData->super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>).
    _M_impl.super__Vector_impl_data._M_finish = pXVar1;
  }
  if (fileOfs != 0) {
    UVar3 = DataLoader_GetSize(this->_dLoad);
    if (fileOfs < UVar3) {
      std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::resize
                (xData,(ulong)this->_fileData[fileOfs]);
      if ((xData->
          super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>).
          _M_impl.super__Vector_impl_data._M_finish !=
          (xData->
          super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        uVar4 = fileOfs + 5;
        __new_size = 0;
        do {
          UVar3 = DataLoader_GetSize(this->_dLoad);
          if (UVar3 < uVar4) {
            std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::resize
                      (xData,__new_size);
            return;
          }
          pXVar1 = (xData->
                   super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pUVar2 = this->_fileData;
          pXVar1[__new_size].type = pUVar2[uVar4 - 4];
          pXVar1[__new_size].flags = pUVar2[uVar4 - 3];
          pXVar1[__new_size].data = *(UINT16 *)(pUVar2 + (uVar4 - 2));
          __new_size = __new_size + 1;
          uVar4 = uVar4 + 4;
        } while (__new_size <
                 (ulong)((long)(xData->
                               super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(xData->
                               super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 2));
      }
    }
  }
  return;
}

Assistant:

void VGMPlayer::ParseXHdr_Data16(UINT32 fileOfs, std::vector<XHDR_DATA16>& xData)
{
	xData.clear();
	if (! fileOfs || fileOfs >= DataLoader_GetSize(_dLoad))
		return;
	
	UINT32 curPos = fileOfs;
	size_t curChip;
	
	xData.resize(_fileData[curPos]);	curPos ++;
	for (curChip = 0; curChip < xData.size(); curChip ++, curPos += 0x04)
	{
		if (curPos + 0x04 > DataLoader_GetSize(_dLoad))
		{
			xData.resize(curChip);
			break;
		}
		
		XHDR_DATA16& cData = xData[curChip];
		cData.type = _fileData[curPos + 0x00];
		cData.flags = _fileData[curPos + 0x01];
		cData.data = ReadLE16(&_fileData[curPos + 0x02]);
	}
	
	return;
}